

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O1

void __thiscall
QAbstractItemViewPrivate::delegateSizeHintChanged(QAbstractItemViewPrivate *this,QModelIndex *index)

{
  ContextType *object;
  char cVar1;
  long in_FS_OFFSET;
  offset_in_QAbstractItemView_to_subr local_38 [2];
  QMetaMethodReturnArgument local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  object = *(ContextType **)
            &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
             field_0x8;
  if (this->model != (QAbstractItemModel *)0x0) {
    cVar1 = QAbstractItemModel::checkIndex(this->model,index,0);
    if (cVar1 == '\0') {
      delegateSizeHintChanged();
    }
  }
  local_38[0] = 0x221;
  local_38[1] = 0;
  local_28.metaType = &QtPrivate::QMetaTypeInterfaceWrapper<void>::metaType;
  local_28.name = (char *)0x0;
  local_28.data = (void *)0x0;
  QMetaObject::invokeMethodCallableHelper<void(QAbstractItemView::*)()>
            (object,local_38,QueuedConnection,&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemViewPrivate::delegateSizeHintChanged(const QModelIndex &index)
{
    Q_Q(QAbstractItemView);
    if (model) {
        if (!model->checkIndex(index))
            qWarning("Delegate size hint changed for a model index that does not belong to this view");
    }
    QMetaObject::invokeMethod(q, &QAbstractItemView::doItemsLayout, Qt::QueuedConnection);
}